

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonObjectCompute(sqlite3_context *ctx,int isFinal)

{
  byte *pbVar1;
  int n;
  Mem *pMVar2;
  JsonString *p;
  
  p = (JsonString *)sqlite3_aggregate_context(ctx,0);
  if (p == (JsonString *)0x0) {
    sqlite3_result_text(ctx,"{}",2,(_func_void_void_ptr *)0x0);
  }
  else {
    jsonAppendChar(p,'}');
    p->pCtx = ctx;
    if (p->eErr != '\0') {
      jsonReturnString(p,(JsonParse *)0x0,(sqlite3_context *)0x0);
      return;
    }
    if (((ulong)ctx->pFunc->pUserData & 8) != 0) {
      jsonReturnStringAsBlob(p);
      if (isFinal == 0) {
        if (p->eErr != '\0') {
          return;
        }
        p->nUsed = p->nUsed - 1;
        return;
      }
      if (p->bStatic != '\0') {
        return;
      }
      sqlite3RCStrUnref(p->zBuf);
      return;
    }
    n = (int)p->nUsed;
    if (isFinal == 0) {
      sqlite3_result_text(ctx,p->zBuf,n,(_func_void_void_ptr *)0xffffffffffffffff);
      if (p->eErr == '\0') {
        p->nUsed = p->nUsed - 1;
      }
    }
    else {
      sqlite3_result_text(ctx,p->zBuf,n,
                          (_func_void_void_ptr *)(-(ulong)(p->bStatic != '\0') | 0x13dce1));
      p->bStatic = '\x01';
    }
  }
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  return;
}

Assistant:

static void jsonObjectCompute(sqlite3_context *ctx, int isFinal){
  JsonString *pStr;
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
  if( pStr ){
    int flags;
    jsonAppendChar(pStr, '}');
    pStr->pCtx = ctx;
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
    if( pStr->eErr ){
      jsonReturnString(pStr, 0, 0);
      return;
    }else if( flags & JSON_BLOB ){
      jsonReturnStringAsBlob(pStr);
      if( isFinal ){
        if( !pStr->bStatic ) sqlite3RCStrUnref(pStr->zBuf);
      }else{
        jsonStringTrimOneChar(pStr);
      }
      return;
    }else if( isFinal ){
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed,
                          pStr->bStatic ? SQLITE_TRANSIENT :
                          sqlite3RCStrUnref);
      pStr->bStatic = 1;
    }else{
      sqlite3_result_text(ctx, pStr->zBuf, (int)pStr->nUsed, SQLITE_TRANSIENT);
      jsonStringTrimOneChar(pStr);
    }
  }else{
    sqlite3_result_text(ctx, "{}", 2, SQLITE_STATIC);
  }
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}